

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r2rect.cc
# Opt level: O2

R2Rect * __thiscall R2Rect::Intersection(R2Rect *__return_storage_ptr__,R2Rect *this,R2Rect *other)

{
  double dVar1;
  double dVar2;
  R1Interval yy;
  R1Interval xx;
  R1Interval local_38;
  R1Interval local_28;
  
  local_28 = R1Interval::Intersection(this->bounds_,other->bounds_);
  dVar2 = local_28.bounds_.c_[1];
  dVar1 = local_28.bounds_.c_[0];
  local_38 = R1Interval::Intersection(this->bounds_ + 1,other->bounds_ + 1);
  if ((dVar2 < dVar1) || (local_38.bounds_.c_[1] < local_38.bounds_.c_[0])) {
    Empty();
  }
  else {
    R2Rect(__return_storage_ptr__,&local_28,&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

R2Rect R2Rect::Intersection(const R2Rect& other) const {
  R1Interval xx = x().Intersection(other.x());
  R1Interval yy = y().Intersection(other.y());
  if (xx.is_empty() || yy.is_empty()) return Empty();
  return R2Rect(xx, yy);
}